

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(int int_id)

{
  ImGuiID IVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  IVar1 = ImGuiWindow::GetIDNoKeepAlive
                    ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(IVar1,in_stack_ffffffffffffffe0),
             (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(int_id);
    window->IDStack.push_back(id);
}